

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Errors.hpp
# Opt level: O3

void Diligent::LogError<true,char_const*,char[26],char[5],char[8]>
               (bool IsFatal,char *Function,char *FullFilePath,int Line,char **Args,
               char (*Args_1) [26],char (*Args_2) [5],char (*Args_3) [8])

{
  long lVar1;
  runtime_error *this;
  size_t sVar2;
  ostream *poVar3;
  char *pcVar4;
  char (*Args_3_00) [26];
  string FileName;
  char local_71;
  string local_70;
  char *local_50;
  long local_48;
  
  Args_3_00 = Args_1;
  std::__cxx11::string::string((string *)&local_50,FullFilePath,(allocator *)&local_70);
  lVar1 = std::__cxx11::string::find_last_of((char *)&local_50,0x6a13db,0xffffffffffffffff);
  if (lVar1 != -1) {
    std::__cxx11::string::erase((ulong)&local_50,0);
  }
  FormatString<char_const*,char[26],char[5],char[8]>
            (&local_70,(Diligent *)Args,(char **)Args_1,(char (*) [26])Args_2,(char (*) [5])Args_3,
             (char (*) [8])Args_3_00);
  if (DebugMessageCallback == (undefined *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Diligent Engine: ",0x11);
    pcVar4 = "Error";
    if (IsFatal) {
      pcVar4 = "Fatal Error";
    }
    lVar1 = 5;
    if (IsFatal) {
      lVar1 = 0xb;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,lVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," in ",4);
    if (Function == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x9a2718);
    }
    else {
      sVar2 = strlen(Function);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,Function,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"() (",4);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_50,local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,Line);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"): ",3);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_70._M_dataplus._M_p,local_70._M_string_length);
    local_71 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_71,1);
  }
  else {
    (*(code *)DebugMessageCallback)(IsFatal | 2,local_70._M_dataplus._M_p,Function,local_50,Line);
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,(string *)&local_70);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void LogError(bool IsFatal, const char* Function, const char* FullFilePath, int Line, const ArgsType&... Args)
{
    std::string FileName(FullFilePath);

    auto LastSlashPos = FileName.find_last_of("/\\");
    if (LastSlashPos != std::string::npos)
        FileName.erase(0, LastSlashPos + 1);
    auto Msg = FormatString(Args...);
    if (DebugMessageCallback != nullptr)
    {
        DebugMessageCallback(IsFatal ? DEBUG_MESSAGE_SEVERITY_FATAL_ERROR : DEBUG_MESSAGE_SEVERITY_ERROR, Msg.c_str(), Function, FileName.c_str(), Line);
    }
    else
    {
        // No callback set - output to cerr
        std::cerr << "Diligent Engine: " << (IsFatal ? "Fatal Error" : "Error") << " in " << Function << "() (" << FileName << ", " << Line << "): " << Msg << '\n';
    }
    ThrowIf<bThrowException>(std::move(Msg));
}